

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

Token * __thiscall EOPlus::Lexer::ReadIdentifier(Token *__return_storage_ptr__,Lexer *this)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char c;
  string s;
  char local_179;
  string local_178;
  Token *local_158;
  code *local_150 [2];
  code *local_140;
  code *local_138;
  function<bool_(char)> local_130;
  string local_110;
  variant local_f0;
  variant local_b0;
  variant local_70;
  
  local_179 = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_130.super__Function_base._M_functor._8_8_ = 0;
  local_130.super__Function_base._M_functor._M_unused._M_object = ctype_ident_start;
  local_130._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_130.super__Function_base._M_manager =
       std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar2 = GetCharIf(this,&local_179,&local_130);
  if (local_130.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_130.super__Function_base._M_manager)
              ((_Any_data *)&local_130,(_Any_data *)&local_130,__destroy_functor);
  }
  if (bVar2) {
    std::__cxx11::string::push_back((char)&local_178);
    local_158 = __return_storage_ptr__;
    while( true ) {
      local_150[1] = (code *)0x0;
      local_150[0] = ctype_ident;
      local_138 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_140 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      bVar2 = GetCharIf(this,&local_179,(function<bool_(char)> *)local_150);
      if (local_140 != (code *)0x0) {
        (*local_140)((_Any_data *)local_150,(_Any_data *)local_150,__destroy_functor);
      }
      if (!bVar2) break;
      std::__cxx11::string::push_back((char)&local_178);
    }
    util::lowercase(&local_110,&local_178);
    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_110);
    __return_storage_ptr__ = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_178);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_178);
      if (iVar3 != 0) {
        util::variant::variant(&local_f0,&local_178);
        __return_storage_ptr__->type = Identifier;
        (__return_storage_ptr__->data).val_int = local_f0.val_int;
        *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_f0._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_f0.val_float._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) =
             local_f0.val_float._4_4_;
        (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->data).val_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->data).val_string,
                   local_f0.val_string._M_dataplus._M_p,
                   local_f0.val_string._M_dataplus._M_p + local_f0.val_string._M_string_length);
        paVar4 = &local_f0.val_string.field_2;
        goto LAB_0013bb6a;
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_178);
    util::variant::variant(&local_b0,iVar3 == 0);
    __return_storage_ptr__->type = Boolean;
    (__return_storage_ptr__->data).val_int = local_b0.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_b0._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_b0.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_b0.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_b0.val_string._M_dataplus._M_p,
               local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
    paVar4 = &local_b0.val_string.field_2;
  }
  else {
    util::variant::variant(&local_70);
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->data).val_int = local_70.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_70._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_70.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_70.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_70.val_string._M_dataplus._M_p,
               local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
    paVar4 = &local_70.val_string.field_2;
  }
LAB_0013bb6a:
  (__return_storage_ptr__->data).type = *(var_type *)(&paVar4->_M_allocated_capacity + 3);
  sVar1 = (&paVar4->_M_allocated_capacity)[2];
  (__return_storage_ptr__->data).val_bool = (bool)(char)sVar1;
  (__return_storage_ptr__->data).cache_val[0] = (bool)(char)(sVar1 >> 8);
  (__return_storage_ptr__->data).cache_val[1] = (bool)(char)(sVar1 >> 0x10);
  (__return_storage_ptr__->data).cache_val[2] = (bool)(char)(sVar1 >> 0x18);
  (__return_storage_ptr__->data).cache_val[3] = (bool)(char)(sVar1 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->data).field_0x35 = (int3)(sVar1 >> 0x28);
  __return_storage_ptr__->newlines = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadIdentifier()
	{
		char c = '\0';
		std::string s;

		if (!this->GetCharIf(c, ctype_ident_start))
			return Token();

		s += c;

		while (this->GetCharIf(c, ctype_ident))
		{
			s += c;
		}

		s = util::lowercase(s);

		if (s == "true" || s == "false")
		{
			return Token(Token::Boolean, s == "true" ? true : false);
		}
		else
		{
			return Token(Token::Identifier, s);
		}
	}